

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall gl3cts::TransformFeedback::QueryVertexSeparate::clean(QueryVertexSeparate *this)

{
  clean((QueryVertexSeparate *)
        ((long)&(this->super_CaptureVertexSeparate)._vptr_CaptureVertexSeparate +
        (long)(this->super_CaptureVertexSeparate)._vptr_CaptureVertexSeparate[-0xe]));
  return;
}

Assistant:

void gl3cts::TransformFeedback::QueryVertexSeparate::clean(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Delete query object. */
	gl.deleteQueries(1, &m_query_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteQueries call failed.");

	/* Other */
	gl3cts::TransformFeedback::CaptureVertexSeparate::clean();
}